

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedDestructorCode
          (MessageGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Printer **ppPVar1;
  bool bVar2;
  Sub *local_588;
  basic_string_view<char,_std::char_traits<char>_> local_520;
  undefined1 local_509;
  anon_class_8_1_54a39810_for_cb local_508;
  allocator<char> local_4f9;
  string local_4f8;
  anon_class_16_2_fd512ddd_for_cb local_4d8;
  allocator<char> local_4c1;
  string local_4c0;
  anon_class_16_2_fd512ddd_for_cb local_4a0;
  allocator<char> local_489;
  string local_488;
  anon_class_24_3_9c178852_for_cb local_468;
  allocator<char> local_449;
  string local_448;
  anon_class_8_1_219898ed_for_cb local_428 [3];
  allocator<char> local_409;
  string local_408;
  Sub *local_3e8;
  Sub local_3e0;
  Sub local_328;
  Sub local_270;
  Sub local_1b8;
  Sub local_100;
  iterator local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_38;
  undefined1 local_28 [8];
  anon_class_16_2_fd512ddd emit_field_dtors;
  Printer *p_local;
  MessageGenerator *this_local;
  
  emit_field_dtors.p = (Printer **)p;
  bVar2 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  ppPVar1 = emit_field_dtors.p;
  if (!bVar2) {
    emit_field_dtors.this = (MessageGenerator *)&emit_field_dtors.p;
    local_509 = 1;
    local_3e8 = &local_3e0;
    local_28 = (undefined1  [8])this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"field_dtors",&local_409);
    local_428[0].emit_field_dtors = (anon_class_16_2_fd512ddd *)local_28;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedDestructorCode(google::protobuf::io::Printer*)::__0>
              (&local_3e0,&local_408,local_428);
    local_3e8 = &local_328;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,"split_field_dtors",&local_449);
    local_468.p = (Printer **)&emit_field_dtors.p;
    local_468.emit_field_dtors = (anon_class_16_2_fd512ddd *)local_28;
    local_468.this = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedDestructorCode(google::protobuf::io::Printer*)::__1>
              (&local_328,&local_448,&local_468);
    local_3e8 = &local_270;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,"oneof_field_dtors",&local_489);
    local_4a0.p = (Printer **)&emit_field_dtors.p;
    local_4a0.this = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedDestructorCode(google::protobuf::io::Printer*)::__2>
              (&local_270,&local_488,&local_4a0);
    local_3e8 = &local_1b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,"weak_fields_dtor",&local_4c1);
    local_4d8.p = (Printer **)&emit_field_dtors.p;
    local_4d8.this = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedDestructorCode(google::protobuf::io::Printer*)::__3>
              (&local_1b8,&local_4c0,&local_4d8);
    local_3e8 = &local_100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"impl_dtor",&local_4f9);
    local_508.p = (Printer **)&emit_field_dtors.p;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedDestructorCode(google::protobuf::io::Printer*)::__4>
              (&local_100,&local_4f8,&local_508);
    local_509 = 0;
    local_48 = &local_3e0;
    local_40 = 5;
    v._M_len = 5;
    v._M_array = local_48;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_38._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_520,
               "\n        inline void $classname$::SharedDtor(MessageLite& self) {\n          $classname$& this_ = static_cast<$classname$&>(self);\n          this_._internal_metadata_.Delete<$unknown_fields_type$>();\n          $DCHK$(this_.GetArena() == nullptr);\n          $WeakDescriptorSelfPin$;\n          $field_dtors$;\n          $split_field_dtors$;\n          $oneof_field_dtors$;\n          $weak_fields_dtor$;\n          $impl_dtor$;\n        }\n      "
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (ppPVar1,local_38._M_allocated_capacity,local_38._8_8_,local_520._M_len,
               local_520._M_str);
    local_588 = (Sub *)&local_48;
    do {
      local_588 = local_588 + -1;
      io::Printer::Sub::~Sub(local_588);
    } while (local_588 != &local_3e0);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator(&local_4f9);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator(&local_489);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator(&local_449);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator(&local_409);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSharedDestructorCode(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  auto emit_field_dtors = [&](bool split_fields) {
    // Write the destructors for each field except oneof members.
    // optimized_order_ does not contain oneof fields.
    for (const auto* field : optimized_order_) {
      if (ShouldSplit(field, options_) != split_fields) continue;
      field_generators_.get(field).GenerateDestructorCode(p);
    }
  };
  p->Emit(
      {
          {"field_dtors", [&] { emit_field_dtors(/* split_fields= */ false); }},
          {"split_field_dtors",
           [&] {
             if (!ShouldSplit(descriptor_, options_)) return;
             p->Emit(
                 {
                     {"split_field_dtors_impl",
                      [&] { emit_field_dtors(/* split_fields= */ true); }},
                 },
                 R"cc(
                   if (PROTOBUF_PREDICT_FALSE(!this_.IsSplitMessageDefault())) {
                     auto* $cached_split_ptr$ = this_.$split$;
                     $split_field_dtors_impl$;
                     delete $cached_split_ptr$;
                   }
                 )cc");
           }},
          {"oneof_field_dtors",
           [&] {
             for (const auto* oneof : OneOfRange(descriptor_)) {
               p->Emit({{"name", oneof->name()}},
                       R"cc(
                         if (this_.has_$name$()) {
                           this_.clear_$name$();
                         }
                       )cc");
             }
           }},
          {"weak_fields_dtor",
           [&] {
             if (num_weak_fields_ == 0) return;
             // Generate code to destruct oneofs. Clearing should do the work.
             p->Emit(R"cc(
               this_.$weak_field_map$.ClearAll();
             )cc");
           }},
          {"impl_dtor", [&] { p->Emit("this_._impl_.~Impl_();\n"); }},
      },
      R"cc(
        inline void $classname$::SharedDtor(MessageLite& self) {
          $classname$& this_ = static_cast<$classname$&>(self);
          this_._internal_metadata_.Delete<$unknown_fields_type$>();
          $DCHK$(this_.GetArena() == nullptr);
          $WeakDescriptorSelfPin$;
          $field_dtors$;
          $split_field_dtors$;
          $oneof_field_dtors$;
          $weak_fields_dtor$;
          $impl_dtor$;
        }
      )cc");
}